

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

sxi32 jx9VmCallUserFunction
                (jx9_vm *pVm,jx9_value *pFunc,int nArg,jx9_value **apArg,jx9_value *pResult)

{
  sxi32 sVar1;
  jx9_value *pStack;
  jx9_value *pDest;
  ulong uVar2;
  ulong uVar3;
  VmInstr aInstr [2];
  
  if ((pFunc->iFlags & 1) == 0) {
    sVar1 = -9;
  }
  else {
    pStack = VmNewOperandStack(pVm,nArg + 1);
    if (pStack != (jx9_value *)0x0) {
      uVar3 = 0;
      uVar2 = 0;
      pDest = pStack;
      if (0 < nArg) {
        uVar2 = (ulong)(uint)nArg;
      }
      for (; uVar2 != uVar3; uVar3 = uVar3 + 1) {
        jx9MemObjLoad(apArg[uVar3],pDest);
        pDest->nIdx = apArg[uVar3]->nIdx;
        pDest = pDest + 1;
      }
      jx9MemObjLoad(pFunc,pStack + uVar2);
      pStack[uVar2].nIdx = 0xffffffff;
      aInstr[0].iOp = '\x10';
      aInstr[0].iP2 = 0;
      aInstr[0].p3 = (void *)0x0;
      aInstr[1].iOp = '\x01';
      aInstr[1].iP1 = 1;
      aInstr[1].iP2 = 0;
      aInstr[1].p3 = (void *)0x0;
      aInstr[0].iP1 = nArg;
      VmByteCodeExec(pVm,aInstr,pStack,nArg,pResult);
      SyMemBackendFree(&pVm->sAllocator,pStack);
      return 0;
    }
    jx9VmThrowError(pVm,(SyString *)0x0,1,
                    "JX9 is running out of memory while invoking user callback");
    sVar1 = -1;
  }
  if (pResult != (jx9_value *)0x0) {
    jx9MemObjRelease(pResult);
  }
  return sVar1;
}

Assistant:

JX9_PRIVATE sxi32 jx9VmCallUserFunction(
	jx9_vm *pVm,       /* Target VM */
	jx9_value *pFunc,  /* Callback name */
	int nArg,          /* Total number of given arguments */
	jx9_value **apArg, /* Callback arguments */
	jx9_value *pResult /* Store callback return value here. NULL otherwise */
	)
{
	jx9_value *aStack;
	VmInstr aInstr[2];
	int i;
	if((pFunc->iFlags & (MEMOBJ_STRING)) == 0 ){
		/* Don't bother processing, it's invalid anyway */
		if( pResult ){
			/* Assume a null return value */
			jx9MemObjRelease(pResult);
		}
		return SXERR_INVALID;
	}
	/* Create a new operand stack */
	aStack = VmNewOperandStack(&(*pVm), 1+nArg);
	if( aStack == 0 ){
		jx9VmThrowError(&(*pVm), 0, JX9_CTX_ERR, 
			"JX9 is running out of memory while invoking user callback");
		if( pResult ){
			/* Assume a null return value */
			jx9MemObjRelease(pResult);
		}
		return SXERR_MEM;
	}
	/* Fill the operand stack with the given arguments */
	for( i = 0 ; i < nArg ; i++ ){
		jx9MemObjLoad(apArg[i], &aStack[i]);
		aStack[i].nIdx = apArg[i]->nIdx;
	}
	/* Push the function name */
	jx9MemObjLoad(pFunc, &aStack[i]);
	aStack[i].nIdx = SXU32_HIGH; /* Mark as constant */
	/* Emit the CALL istruction */
	aInstr[0].iOp = JX9_OP_CALL;
	aInstr[0].iP1 = nArg; /* Total number of given arguments */
	aInstr[0].iP2 = 0;
	aInstr[0].p3  = 0;
	/* Emit the DONE instruction */
	aInstr[1].iOp = JX9_OP_DONE;
	aInstr[1].iP1 = 1;   /* Extract function return value if available */
	aInstr[1].iP2 = 0;
	aInstr[1].p3  = 0;
	/* Execute the function body (if available) */
	VmByteCodeExec(&(*pVm), aInstr, aStack, nArg, pResult);
	/* Clean up the mess left behind */
	SyMemBackendFree(&pVm->sAllocator, aStack);
	return JX9_OK;
}